

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgthd(char *tmplt,char *card,int *hdtype,int *status)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  int tstatus;
  char *suffix;
  char keyname [75];
  char value [140];
  char tvalue [140];
  char comment [140];
  
  if (0 < *status) {
    return *status;
  }
  *card = '\0';
  *hdtype = 0;
  if ((*tmplt == ' ') && (iVar2 = strncmp(tmplt,"        ",8), iVar2 == 0)) {
    strncat(card,tmplt,0x50);
    *hdtype = 1;
    goto LAB_0013b8ea;
  }
  keyname._0_4_ = keyname._0_4_ & 0xffffff00;
  value._0_2_ = (ushort)(byte)value[1] << 8;
  comment[0] = '\0';
  sVar4 = strspn(tmplt," ");
  pcVar7 = tmplt + (int)sVar4;
  iVar2 = strncmp(pcVar7,"--------------------",0x14);
  if (iVar2 == 0) goto LAB_0013b635;
  if (*pcVar7 == '-') {
    *hdtype = -1;
    sVar4 = strspn(pcVar7 + 1," ");
    pcVar7 = pcVar7 + (long)(int)sVar4 + 1;
    sVar4 = strcspn(pcVar7," =+");
    iVar2 = (int)sVar4;
    if (iVar2 < 0x4b) {
      sVar4 = (size_t)iVar2;
      strncat(card,pcVar7,sVar4);
      if (iVar2 < 9) {
        ffupch(card);
        tstatus = 0;
        iVar3 = fftkey(card,&tstatus);
        if (0 < iVar3) {
          *card = '\0';
          strncat(card,pcVar7,sVar4);
        }
      }
      if (pcVar7[sVar4] == '+') {
        sVar4 = strlen(card);
        (card + sVar4)[0] = '+';
        (card + sVar4)[1] = '\0';
      }
      else {
        pcVar7 = pcVar7 + sVar4;
        sVar4 = strspn(pcVar7," ");
        if ((pcVar7[(int)sVar4] != '=') && (pcVar7[(int)sVar4] != '\0')) {
          pcVar7 = pcVar7 + (int)sVar4;
          *hdtype = -2;
          sVar4 = strcspn(pcVar7," ");
          if ((0x28 < iVar2) || (iVar2 = (int)sVar4, 0x28 < iVar2)) {
            *card = '\0';
            goto LAB_0013b635;
          }
          sVar4 = strlen(card);
          builtin_strncpy(card + sVar4,"                                        ",0x29);
          pcVar8 = card + 0x28;
          strncpy(pcVar8,pcVar7,(long)iVar2);
          card[0x50] = '\0';
          if (iVar2 < 9) {
            ffupch(pcVar8);
            tstatus = 0;
            iVar3 = fftkey(pcVar8,&tstatus);
            if (0 < iVar3) {
              strncpy(pcVar8,pcVar7,(long)iVar2);
            }
          }
        }
      }
      goto LAB_0013b8ea;
    }
    goto LAB_0013b635;
  }
  sVar4 = strcspn(pcVar7," =");
  iVar2 = (int)sVar4;
  if (0x4a < iVar2) goto LAB_0013b635;
  sVar4 = (size_t)iVar2;
  strncat(keyname,pcVar7,sVar4);
  if (iVar2 < 9) {
    ffupch(keyname);
    tstatus = 0;
    iVar2 = fftkey(keyname,&tstatus);
    if (0 < iVar2) {
      keyname._0_4_ = keyname._0_4_ & 0xffffff00;
      strncat(keyname,pcVar7,sVar4);
    }
  }
  if (keyname._0_4_ == 0x444e45 && keyname[0] == 'E') {
    builtin_strncpy(card,"END",4);
    *hdtype = 2;
    goto LAB_0013b8ea;
  }
  pcVar7 = pcVar7 + sVar4;
  if ((CONCAT44(keyname._4_4_,keyname._0_4_) == 0x59524f54534948 ||
       CONCAT44(keyname._4_4_,keyname._0_4_) == 0x544e454d4d4f43 && keyname[0] == 'C') ||
     ((keyname[0] == 'H' && (iVar2 = bcmp(keyname,"HIERARCH",9), iVar2 == 0)))) {
    *hdtype = 1;
    strcpy(card,keyname);
    strncat(card,pcVar7,0x48);
    goto LAB_0013b8ea;
  }
  sVar4 = strspn(pcVar7," =");
  pcVar8 = pcVar7 + (int)sVar4;
  cVar1 = pcVar7[(int)sVar4];
  if ((cVar1 == '\0') || (cVar1 == '/')) {
    sVar4 = strlen(value);
    (value + sVar4)[0] = ' ';
    (value + sVar4)[1] = '\0';
  }
  else if (cVar1 == '\'') {
    bVar9 = true;
    iVar2 = 0x8b;
    while (bVar9) {
      sVar4 = strcspn(pcVar8 + 1,"\'");
      iVar3 = (int)sVar4 + 2;
      if (iVar2 < iVar3) goto LAB_0013b635;
      strncat(value,pcVar8,(long)iVar3);
      lVar5 = (long)((sVar4 << 0x20) + 0x100000000) >> 0x20;
      if (pcVar8[lVar5] != '\'') {
        *status = 0xcd;
        return 0xcd;
      }
      bVar9 = pcVar8[lVar5 + 1] == '\'';
      pcVar8 = pcVar8 + lVar5 + 1;
      iVar2 = iVar2 - iVar3;
    }
  }
  else {
    sVar4 = strcspn(pcVar8," /");
    iVar2 = (int)sVar4;
    if (0x8b < iVar2) goto LAB_0013b635;
    sVar4 = (size_t)iVar2;
    strncat(value,pcVar8,sVar4);
    if ((((cVar1 != 'T') && (cVar1 != 'F')) || (0x2f < (ulong)(byte)pcVar8[1])) ||
       ((0x800100000001U >> ((ulong)(byte)pcVar8[1] & 0x3f) & 1) == 0)) {
      strtod(value,&suffix);
      if ((0x2f < (ulong)(byte)*suffix) ||
         ((0x800100000001U >> ((ulong)(byte)*suffix & 0x3f) & 1) == 0)) {
        strcpy(tvalue,value);
        pcVar7 = strchr(tvalue,0x44);
        if ((pcVar7 == (char *)0x0) && (pcVar7 = strchr(tvalue,100), pcVar7 == (char *)0x0)) {
          pcVar7 = strchr(tvalue,0x2e);
          if (pcVar7 == (char *)0x0) goto LAB_0013b9e5;
          *pcVar7 = ',';
        }
        else {
          *pcVar7 = 'E';
        }
        strtod(tvalue,&suffix);
      }
LAB_0013b9e5:
      if (((ulong)(byte)*suffix < 0x30) &&
         ((0x800100000001U >> ((ulong)(byte)*suffix & 0x3f) & 1) != 0)) {
        pcVar7 = strchr(value,0x65);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = strchr(value,100);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = 'D';
          }
        }
        else {
          *pcVar7 = 'E';
        }
      }
      else {
        if (0x89 < iVar2) {
LAB_0013b635:
          *status = 0xcf;
          return 0xcf;
        }
        value[0] = '\'';
        value[1] = '\0';
        strncat(value,pcVar8,sVar4);
        sVar6 = strlen(value);
        (value + sVar6)[0] = '\'';
        (value + sVar6)[1] = '\0';
      }
    }
    pcVar8 = pcVar8 + sVar4;
  }
  sVar4 = strspn(pcVar8," /");
  sVar6 = strlen(value);
  iVar2 = (int)sVar6;
  if ((iVar2 - 1U < 9) && (value[0] == '\'')) {
    value[iVar2 - 1] = '\0';
    strncat(value,"        ",(ulong)(10 - iVar2));
    sVar6 = strlen(value + 9);
    (value + sVar6 + 9)[0] = '\'';
    (value + sVar6 + 9)[1] = '\0';
  }
  strncat(comment,pcVar8 + (int)sVar4,0x46);
  ffmkky(keyname,value,comment,card,status);
LAB_0013b8ea:
  return *status;
}

Assistant:

int ffgthd(char *tmplt, /* I - input header template string */
           char *card,  /* O - returned FITS header record */
           int *hdtype, /* O - how to interpreter the returned card string */ 
            /*
              -2 = modify the name of a keyword; the old keyword name
                   is returned starting at address chars[0]; the new name
                   is returned starting at address char[40] (to be consistent
                   with the Fortran version).  Both names are null terminated. 
              -1 = card contains the name of a keyword that is to be deleted
               0 = append this keyword if it doesn't already exist, or 
                   modify the value if the keyword already exists.
               1 = append this comment keyword ('HISTORY', 
                   'COMMENT', or blank keyword name) 
               2  =  this is the END keyword; do not write it to the header
            */
           int *status)   /* IO - error status   */
/*
  'Get Template HeaDer'
  parse a template header line and create a formated
  character string which is suitable for appending to a FITS header 
*/
{
    char keyname[FLEN_KEYWORD], value[140], comment[140];
    char *tok, *suffix, *loc, tvalue[140];
    int len, vlen, more, tstatus, lentok1=0, remainlen=0;
    double dval;

    if (*status > 0)
        return(*status);

    card[0]   = '\0';
    *hdtype   = 0;

    if (!FSTRNCMP(tmplt, "        ", 8) )
    {
        /* if first 8 chars of template are blank, then this is a comment */
        strncat(card, tmplt, 80);
        *hdtype = 1;
        return(*status);
    }

    tok = tmplt;   /* point to start of template string */
 
    keyname[0] = '\0';
    value[0]   = '\0';
    comment[0] = '\0';

    len = strspn(tok, " ");  /* no. of spaces before keyword */
    tok += len;

    /* test for pecular case where token is a string of dashes */
    if (strncmp(tok, "--------------------", 20) == 0)
            return(*status = BAD_KEYCHAR);

    if (tok[0] == '-')  /* is there a leading minus sign? */
    {
        /* first token is name of keyword to be deleted or renamed */
        *hdtype = -1;
        tok++;
        len = strspn(tok, " ");  /* no. of spaces before keyword */
        tok += len;
        
        len = strcspn(tok, " =+");  /* length of name */
        if (len >= FLEN_KEYWORD)
          return(*status = BAD_KEYCHAR);

        lentok1 = len;
        strncat(card, tok, len);

        /*
          The HIERARCH convention supports non-standard characters
          in the keyword name, so don't always convert to upper case or
          abort if there are illegal characters in the name or if the
          name is greater than 8 characters long.
        */

        if (len < 9)  /* this is possibly a normal FITS keyword name */
        {
          ffupch(card);
          tstatus = 0;
          if (fftkey(card, &tstatus) > 0)
          {
             /* name contained non-standard characters, so reset */
             card[0] = '\0';
             strncat(card, tok, len);
          }
        }

        tok += len;

	/* Check optional "+" indicator to delete multiple keywords */
	if (tok[0] == '+' && len < FLEN_KEYWORD) {
	  strcat(card, "+");
	  return (*status);
	}

        /* second token, if present, is the new name for the keyword */

        len = strspn(tok, " ");  /* no. of spaces before next token */
        tok += len;

        if (tok[0] == '\0' || tok[0] == '=')
            return(*status);  /* no second token */

        *hdtype = -2;
        len = strcspn(tok, " ");  /* length of new name */
        /* this name has to fit on columns 41-80 of card,
           and first name must now fit in 1-40 */
        if (lentok1 > 40)
        {
           card[0] = '\0';
           return (*status = BAD_KEYCHAR);
        }
        if (len > 40)
        {
           card[0] = '\0'; 
           return(*status = BAD_KEYCHAR);
        }

        /* copy the new name to card + 40;  This is awkward, */
        /* but is consistent with the way the Fortran FITSIO works */
	strcat(card,"                                        ");
        strncpy(&card[40], tok, len);
        card[80] = '\0'; /* necessary to add terminator in case len = 40 */

        /*
            The HIERARCH convention supports non-standard characters
            in the keyword name, so don't always convert to upper case or
            abort if there are illegal characters in the name or if the
            name is greater than 8 characters long.
        */

        if (len < 9)  /* this is possibly a normal FITS keyword name */
        {
            ffupch(&card[40]);
            tstatus = 0;
            if (fftkey(&card[40], &tstatus) > 0)
            {
               /* name contained non-standard characters, so reset */
               strncpy(&card[40], tok, len);
            }
        }
    }
    else  /* no negative sign at beginning of template */
    {
      /* get the keyword name token */

      len = strcspn(tok, " =");  /* length of keyword name */
      if (len >= FLEN_KEYWORD)
        return(*status = BAD_KEYCHAR);

      strncat(keyname, tok, len);

      /*
        The HIERARCH convention supports non-standard characters
        in the keyword name, so don't always convert to upper case or
        abort if there are illegal characters in the name or if the
        name is greater than 8 characters long.
      */

      if (len < 9)  /* this is possibly a normal FITS keyword name */
      {
        ffupch(keyname);
        tstatus = 0;
        if (fftkey(keyname, &tstatus) > 0)
        {
           /* name contained non-standard characters, so reset */
           keyname[0] = '\0';
           strncat(keyname, tok, len);
        }
      }

      if (!FSTRCMP(keyname, "END") )
      {
         strcpy(card, "END");
         *hdtype = 2;
         return(*status);
      }

      tok += len; /* move token pointer to end of the keyword */

      if (!FSTRCMP(keyname, "COMMENT") || !FSTRCMP(keyname, "HISTORY")
         || !FSTRCMP(keyname, "HIERARCH") )
      {
        *hdtype = 1;   /* simply append COMMENT and HISTORY keywords */
        strcpy(card, keyname);
        strncat(card, tok, 72);
        return(*status);
      }

      /* look for the value token */
      len = strspn(tok, " =");  /* spaces or = between name and value */
      tok += len;

      if (*tok == '\'') /* is value enclosed in quotes? */
      {
          more = TRUE;
          remainlen = 139;
          while (more)
          {
            tok++;  /* temporarily move past the quote char */
            len = strcspn(tok, "'");  /* length of quoted string */
            tok--;
            if (len+2 > remainlen)
               return (*status=BAD_KEYCHAR);
            strncat(value, tok, len + 2);
            remainlen -= (len+2); 
 
            tok += len + 1;
            if (tok[0] != '\'')   /* check there is a closing quote */
              return(*status = NO_QUOTE);

            tok++;
            if (tok[0] != '\'')  /* 2 quote chars = literal quote */
              more = FALSE;
          }
      }
      else if (*tok == '/' || *tok == '\0')  /* There is no value */
      {
          strcat(value, " ");
      }
      else   /* not a quoted string value */
      {
          len = strcspn(tok, " /"); /* length of value string */
          if (len > 139)
             return (*status=BAD_KEYCHAR);
          strncat(value, tok, len);
          if (!( (tok[0] == 'T' || tok[0] == 'F') &&
                 (tok[1] == ' ' || tok[1] == '/' || tok[1] == '\0') )) 
          {
             /* not a logical value */

            dval = strtod(value, &suffix); /* try to read value as number */

            if (*suffix != '\0' && *suffix != ' ' && *suffix != '/')
            { 
                /* value not recognized as a number; might be because it */
                /* contains a 'd' or 'D' exponent character  */ 
                strcpy(tvalue, value);
                if ((loc = strchr(tvalue, 'D')))
                {          
                    *loc = 'E'; /*  replace D's with E's. */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
                else if ((loc = strchr(tvalue, 'd')))
                {
                    *loc = 'E'; /*  replace d's with E's. */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
                else if ((loc = strchr(tvalue, '.')))
                {
                    *loc = ','; /*  replace period with a comma */ 
                    dval = strtod(tvalue, &suffix); /* read value again */
                }
            }
   
            if (*suffix != '\0' && *suffix != ' ' && *suffix != '/')
            { 
              /* value is not a number; must enclose it in quotes */
              if (len > 137)
                return (*status=BAD_KEYCHAR);              
              strcpy(value, "'");
              strncat(value, tok, len);
              strcat(value, "'");

              /* the following useless statement stops the compiler warning */
              /* that dval is not used anywhere */
              if (dval == 0.)
                 len += (int) dval; 
            }
            else  
            {
                /* value is a number; convert any 'e' to 'E', or 'd' to 'D' */
                loc = strchr(value, 'e');
                if (loc)
                {          
                    *loc = 'E';  
                }
                else
                {
                    loc = strchr(value, 'd');
                    if (loc)
                    {          
                        *loc = 'D';  
                    }
                }
            }
          }
          tok += len;
      }

      len = strspn(tok, " /"); /* no. of spaces between value and comment */
      tok += len;

      vlen = strlen(value);
      if (vlen > 0 && vlen < 10 && value[0] == '\'')
      {
          /* pad quoted string with blanks so it is at least 8 chars long */
          value[vlen-1] = '\0';
          strncat(value, "        ", 10 - vlen);
          strcat(&value[9], "'");
      }

      /* get the comment string */
      strncat(comment, tok, 70);

      /* construct the complete FITS header card */
      ffmkky(keyname, value, comment, card, status);
    }
    return(*status);
}